

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrContext.cpp
# Opt level: O0

void __thiscall
sglr::Context::texSubImage2D
          (Context *this,deUint32 target,int level,int xoffset,int yoffset,Surface *src)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  ConstPixelBufferAccess local_58;
  int local_30;
  uint local_2c;
  int height;
  int width;
  Surface *src_local;
  int yoffset_local;
  int xoffset_local;
  int level_local;
  deUint32 target_local;
  Context *this_local;
  
  _height = src;
  src_local._0_4_ = yoffset;
  src_local._4_4_ = xoffset;
  yoffset_local = level;
  xoffset_local = target;
  _level_local = this;
  local_2c = tcu::Surface::getWidth(src);
  iVar6 = tcu::Surface::getHeight(_height);
  iVar5 = xoffset_local;
  iVar4 = yoffset_local;
  uVar3 = src_local._4_4_;
  uVar2 = (uint)src_local;
  uVar1 = local_2c;
  local_30 = iVar6;
  tcu::Surface::getAccess(&local_58,_height);
  pvVar7 = tcu::ConstPixelBufferAccess::getDataPtr(&local_58);
  (*this->_vptr_Context[0x14])
            (this,(ulong)(uint)iVar5,(ulong)(uint)iVar4,(ulong)uVar3,(ulong)uVar2,(ulong)uVar1,iVar6
             ,0x1908,0x1401,pvVar7);
  return;
}

Assistant:

void Context::texSubImage2D (deUint32 target, int level, int xoffset, int yoffset, const tcu::Surface& src)
{
	int		width	= src.getWidth();
	int		height	= src.getHeight();
	texSubImage2D(target, level, xoffset, yoffset, width, height, GL_RGBA, GL_UNSIGNED_BYTE, src.getAccess().getDataPtr());
}